

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

shared_ptr<chrono::ChBody> __thiscall
chrono::utils::CreateCylindricalContainerFromBoxes
          (utils *this,ChSystem *system,int id,shared_ptr<chrono::ChMaterialSurface> *mat,
          ChVector<double> *hdim,double hthick,int numBoxes,ChVector<double> *pos,
          ChQuaternion<double> *rot,bool collide,bool overlap,bool closed,bool isBoxBase,
          bool partialVisualization)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  long *plVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ChBody *pCVar8;
  element_type *peVar9;
  undefined1 auVar10 [16];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  shared_ptr<chrono::ChMaterialSurface> *psVar20;
  ChSystem *pCVar21;
  int iVar22;
  int iVar23;
  undefined4 extraout_var;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var24;
  undefined1 auVar25 [16];
  double dVar26;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  shared_ptr<chrono::ChBody> sVar30;
  ChVector<double> p_boxSize;
  ChVector<double> local_1c8;
  ChQuaternion<double> local_1b0;
  shared_ptr<chrono::ChMaterialSurface> *local_190;
  shared_ptr<chrono::ChMaterialSurface> local_188;
  shared_ptr<chrono::ChMaterialSurface> local_178;
  shared_ptr<chrono::ChMaterialSurface> local_168;
  shared_ptr<chrono::ChMaterialSurface> local_158;
  double local_148;
  double dStack_140;
  double local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  shared_ptr<chrono::ChMaterialSurface> local_118;
  utils *local_100;
  ChSystem *local_f8;
  double local_f0;
  shared_ptr<chrono::ChVisualMaterial> local_e8;
  shared_ptr<chrono::ChVisualMaterial> local_d8;
  ChVector<double> local_c8;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  ChVector<double> local_80;
  double local_68;
  double dStack_60;
  ChQuaternion<double> local_50;
  undefined1 extraout_var_00 [56];
  
  local_190 = mat;
  iVar22 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->_vptr_ChMaterialSurface[3])();
  iVar23 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                     (system);
  if (iVar22 != iVar23) {
    __assert_fail("mat->GetContactMethod() == system->GetContactMethod()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsCreators.cpp"
                  ,700,
                  "std::shared_ptr<ChBody> chrono::utils::CreateCylindricalContainerFromBoxes(ChSystem *, int, std::shared_ptr<ChMaterialSurface>, const ChVector<> &, double, int, const ChVector<> &, const ChQuaternion<> &, bool, bool, bool, bool, bool)"
                 );
  }
  iVar22 = (*(system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x30])
                     (system);
  local_100 = this + 8;
  *(ChBody **)this = (ChBody *)CONCAT44(extraout_var,iVar22);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_100,
             (ChBody *)CONCAT44(extraout_var,iVar22));
  lVar5 = *(long *)this;
  *(int *)(lVar5 + 0x28) = id;
  if ((ChVector<double> *)(lVar5 + 0x80) != pos) {
    *(double *)(lVar5 + 0x80) = pos->m_data[0];
    *(double *)(lVar5 + 0x88) = pos->m_data[1];
    *(double *)(lVar5 + 0x90) = pos->m_data[2];
  }
  ChFrame<double>::SetRot((ChFrame<double> *)(lVar5 + 0x78),rot);
  ChBody::SetCollide(*(ChBody **)this,collide);
  ChBody::SetBodyFixed(*(ChBody **)this,true);
  local_138 = hdim->m_data[0] + hdim->m_data[0];
  local_148 = (double)numBoxes;
  dVar26 = tan(3.141592653589793 / local_148);
  local_80.m_data[2] = (double)((ulong)overlap * (long)(hthick + hthick)) + hdim->m_data[2];
  local_80.m_data[0] = (dVar26 * local_138 + hthick) * 0.5;
  local_c8.m_data[2] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_50.m_data[0] = QUNIT;
  local_50.m_data[1] = DAT_00b68858;
  local_50.m_data[2] = DAT_00b68860;
  local_50.m_data[3] = DAT_00b68868;
  plVar6 = *(long **)(*(long *)this + 0x198);
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  local_80.m_data[1] = hthick;
  (**(code **)(*plVar6 + 0x18))();
  local_f8 = system;
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  if (0 < numBoxes) {
    iVar22 = 0;
    local_f0 = 6.283185307179586 / local_148;
    local_68 = hthick;
    dStack_60 = hthick;
    do {
      dVar26 = (double)iVar22 * local_f0;
      local_138 = sin(dVar26);
      local_148 = hdim->m_data[0];
      dStack_140 = hdim->m_data[1];
      uStack_130 = extraout_XMM0_Qb;
      auVar27._0_8_ = cos(dVar26);
      auVar27._8_56_ = extraout_var_00;
      auVar10._8_8_ = dStack_140;
      auVar10._0_8_ = local_148;
      auVar25._8_8_ = uStack_130;
      auVar25._0_8_ = local_138;
      auVar10 = vmovhpd_avx(auVar10,hdim->m_data[0]);
      local_c8.m_data[2] = hdim->m_data[2] + pos->m_data[2];
      auVar25 = vunpcklpd_avx(auVar25,auVar27._0_16_);
      local_c8.m_data[0] = auVar25._0_8_ * (auVar10._0_8_ + local_68) + pos->m_data[0];
      local_c8.m_data[1] = auVar25._8_8_ * (auVar10._8_8_ + dStack_60) + pos->m_data[1];
      local_1c8.m_data[0] = 0.0;
      local_1c8.m_data[1] = 0.0;
      local_1c8.m_data[2] = dVar26;
      Angle_to_Quat(&local_1b0,RXYZ,&local_1c8);
      pCVar8 = *(ChBody **)this;
      local_50.m_data[0] = local_1b0.m_data[0];
      local_50.m_data[1] = local_1b0.m_data[1];
      local_50.m_data[2] = local_1b0.m_data[2];
      local_50.m_data[3] = local_1b0.m_data[3];
      local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      p_Var7 = (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      ChVisualMaterial::Default();
      auVar19._8_8_ = 0;
      auVar19._0_8_ = dVar26;
      uVar11 = vcmppd_avx512vl(auVar19,ZEXT816(0x4012d97c7f3321d2),5);
      uVar12 = vcmppd_avx512vl(ZEXT816(0x400921fb54442d18),auVar19,5);
      AddBoxGeometry(pCVar8,&local_118,&local_80,&local_c8,&local_50,
                     (bool)(((byte)uVar12 & 3 | (byte)uVar11 & 3) & 1 | !partialVisualization),
                     &local_90);
      if (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_118.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      iVar22 = iVar22 + 1;
    } while (numBoxes != iVar22);
  }
  psVar20 = local_190;
  pCVar8 = *(ChBody **)this;
  peVar9 = (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (isBoxBase) {
    local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    auVar15._8_8_ = in_XMM0_Qb;
    auVar15._0_8_ = hthick;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = hdim->m_data[0];
    auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar15,auVar1);
    auVar13._8_8_ = 0x8000000000000000;
    auVar13._0_8_ = 0x8000000000000000;
    auVar25 = vxorpd_avx512vl(auVar15,auVar13);
    local_1b0.m_data[0] = auVar10._0_8_;
    local_1c8.m_data[0] = 0.0;
    local_1c8.m_data[1] = 0.0;
    local_1c8.m_data[2] = (double)vmovlpd_avx(auVar25);
    local_1b0.m_data[1] = local_1b0.m_data[0];
    local_1b0.m_data[2] = hthick;
    local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar9;
    ChVisualMaterial::Default();
    AddBoxGeometry(pCVar8,&local_158,(ChVector<double> *)&local_1b0,&local_1c8,
                   (ChQuaternion<double> *)&QUNIT,true,&local_a0);
    _Var24._M_pi = local_158.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var24._M_pi = local_158.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  else {
    local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (local_190->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
    if (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    auVar16._8_8_ = in_XMM0_Qb;
    auVar16._0_8_ = hthick;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = hdim->m_data[0];
    auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar16,auVar2);
    auVar14._8_8_ = 0x8000000000000000;
    auVar14._0_8_ = 0x8000000000000000;
    auVar25 = vxorpd_avx512vl(auVar16,auVar14);
    local_1c8.m_data[0] = 0.0;
    local_1c8.m_data[1] = 0.0;
    local_1c8.m_data[2] = (double)vmovlpd_avx(auVar25);
    local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar9;
    Q_from_AngAxis(&local_1b0,1.5707963267948966,(ChVector<double> *)&VECT_X);
    ChVisualMaterial::Default();
    AddCylinderGeometry(pCVar8,&local_168,auVar10._0_8_,hthick,&local_1c8,&local_1b0,true,&local_d8)
    ;
    _Var24._M_pi = local_168.
                   super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_d8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_d8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var24._M_pi = local_168.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
  }
  if (_Var24._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var24._M_pi);
  }
  if (closed) {
    pCVar8 = *(ChBody **)this;
    peVar9 = (psVar20->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (isBoxBase) {
      local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar20->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      auVar28._8_8_ = 0;
      auVar28._0_8_ = hdim->m_data[0];
      auVar17._8_8_ = in_XMM0_Qb;
      auVar17._0_8_ = hthick;
      auVar10 = vfmadd231sd_fma(auVar28,auVar17,ZEXT816(0x4000000000000000));
      local_1b0.m_data[0] = auVar10._0_8_;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = hdim->m_data[2];
      auVar10 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar17,auVar3);
      local_1c8.m_data[0] = 0.0;
      local_1c8.m_data[1] = 0.0;
      local_1c8.m_data[2] = auVar10._0_8_;
      local_1b0.m_data[1] = local_1b0.m_data[0];
      local_1b0.m_data[2] = hthick;
      local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar9;
      ChVisualMaterial::Default();
      AddBoxGeometry(pCVar8,&local_178,(ChVector<double> *)&local_1b0,&local_1c8,
                     (ChQuaternion<double> *)&QUNIT,true,&local_b0);
      _Var24._M_pi = local_178.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var24._M_pi = local_178.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
    }
    else {
      local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (psVar20->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      auVar29._8_8_ = 0;
      auVar29._0_8_ = hdim->m_data[0];
      auVar18._8_8_ = in_XMM0_Qb;
      auVar18._0_8_ = hthick;
      auVar25 = vfmadd231sd_fma(auVar29,auVar18,ZEXT816(0x4000000000000000));
      auVar4._8_8_ = 0;
      auVar4._0_8_ = hdim->m_data[2];
      auVar10 = vfmadd132sd_fma(ZEXT816(0x4000000000000000),auVar18,auVar4);
      local_1c8.m_data[0] = 0.0;
      local_1c8.m_data[1] = 0.0;
      local_1c8.m_data[2] = auVar10._0_8_;
      local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar9;
      Q_from_AngAxis(&local_1b0,1.5707963267948966,(ChVector<double> *)&VECT_X);
      ChVisualMaterial::Default();
      AddCylinderGeometry(pCVar8,&local_188,auVar25._0_8_,hthick,&local_1c8,&local_1b0,true,
                          &local_e8);
      _Var24._M_pi = local_188.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      if (local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var24._M_pi = local_188.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
    }
    if (_Var24._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var24._M_pi);
    }
  }
  pCVar21 = local_f8;
  plVar6 = *(long **)(*(long *)this + 0x198);
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar6 + 0x120))(hthick * 0.2);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  plVar6 = *(long **)(*(long *)this + 0x198);
  p_Var7 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)this + 0x1a0);
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
  }
  (**(code **)(*plVar6 + 0x20))();
  if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
  }
  local_128 = *(undefined8 *)this;
  p_Stack_120 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8);
  lVar5 = *(long *)(this + 8);
  if (lVar5 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar5 + 8) = *(int *)(lVar5 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar5 + 8) = *(int *)(lVar5 + 8) + 1;
    }
  }
  (*(pCVar21->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
            (pCVar21,&local_128);
  _Var24._M_pi = extraout_RDX;
  if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
    _Var24._M_pi = extraout_RDX_00;
  }
  sVar30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var24._M_pi;
  sVar30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChBody>)
         sVar30.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChBody> CreateCylindricalContainerFromBoxes(ChSystem* system,
                                                            int id,
                                                            std::shared_ptr<ChMaterialSurface> mat,
                                                            const ChVector<>& hdim,
                                                            double hthick,
                                                            int numBoxes,
                                                            const ChVector<>& pos,
                                                            const ChQuaternion<>& rot,
                                                            bool collide,
                                                            bool overlap,
                                                            bool closed,
                                                            bool isBoxBase,
                                                            bool partialVisualization) {
    // Verify consistency of input arguments.
    assert(mat->GetContactMethod() == system->GetContactMethod());

    // Create the body and set material
    std::shared_ptr<ChBody> body(system->NewBody());

    // Set body properties and geometry.
    body->SetIdentifier(id);
    // body->SetMass(1);
    body->SetPos(pos);
    body->SetRot(rot);
    body->SetCollide(collide);
    body->SetBodyFixed(true);

    double box_side = hdim.x() * 2.0 * tan(CH_C_PI / numBoxes);  // side length of cyl
    double o_lap = 0;
    if (overlap) {
        o_lap = hthick * 2;
    }
    double ang = 2.0 * CH_C_PI / numBoxes;
    ChVector<> p_boxSize = ChVector<>((box_side + hthick) / 2.0, hthick, hdim.z() + o_lap);  // size of plates
    ChVector<> p_pos;                                                                        // position of each plate
    ChQuaternion<> p_quat = QUNIT;                                                           // rotation of each plate
    body->GetCollisionModel()->ClearModel();

    for (int i = 0; i < numBoxes; i++) {
        p_pos = pos + ChVector<>(sin(ang * i) * (hthick + hdim.x()), cos(ang * i) * (hthick + hdim.x()), hdim.z());

        p_quat = Angle_to_Quat(AngleSet::RXYZ, ChVector<>(0, 0, ang * i));

        // this is here to make half the cylinder invisible.
        bool m_visualization = true;
        if ((ang * i > CH_C_PI && ang * i < 3.0 * CH_C_PI / 2.0) && partialVisualization) {
            m_visualization = false;
        }
        utils::AddBoxGeometry(body.get(), mat, p_boxSize, p_pos, p_quat, m_visualization);
    }

    // Add ground piece
    if (isBoxBase) {
        utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                              Vector(0, 0, -hthick), QUNIT, true);
    } else {
        utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick, ChVector<>(0, 0, -hthick),
                                   Q_from_AngAxis(CH_C_PI / 2, VECT_X));
    }

    if (closed) {
        if (isBoxBase) {
            utils::AddBoxGeometry(body.get(), mat, Vector(hdim.x() + 2 * hthick, hdim.x() + 2 * hthick, hthick),
                                  Vector(0, 0, 2 * hdim.z() + hthick), QUNIT, true);
        } else {
            utils::AddCylinderGeometry(body.get(), mat, hdim.x() + 2 * hthick, hthick,
                                       ChVector<>(0, 0, 2 * hdim.z() + hthick), Q_from_AngAxis(CH_C_PI / 2, VECT_X));
        }
    }

    body->GetCollisionModel()->SetEnvelope(0.2 * hthick);
    body->GetCollisionModel()->BuildModel();

    system->AddBody(body);
    return body;
}